

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<long_double,_TPZFileEqnStorage<long_double>,_TPZFrontSym<long_double>_>::
TPZFrontMatrix(TPZFrontMatrix<long_double,_TPZFileEqnStorage<long_double>,_TPZFrontSym<long_double>_>
               *this)

{
  TPZRegisterClassId *in_RDI;
  TPZRegisterClassId *this_00;
  TPZVec<int> *this_01;
  void **in_stack_ffffffffffffffb8;
  TPZAbstractFrontMatrix<long_double> *in_stack_ffffffffffffffc0;
  int64_t in_stack_ffffffffffffffd8;
  TPZVec<int> *in_stack_ffffffffffffffe0;
  TPZFileEqnStorage<long_double> *this_02;
  
  this_02 = (TPZFileEqnStorage<long_double> *)0x0;
  TPZRegisterClassId::
  TPZRegisterClassId<TPZFrontMatrix<long_double,TPZFileEqnStorage<long_double>,TPZFrontSym<long_double>>>
            (in_RDI,0x21);
  TPZAbstractFrontMatrix<long_double>::TPZAbstractFrontMatrix
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *(undefined ***)in_RDI = &PTR__TPZFrontMatrix_025439d8;
  TPZFileEqnStorage<long_double>::TPZFileEqnStorage(this_02);
  this_00 = in_RDI + 0xd8;
  TPZFrontSym<long_double>::TPZFrontSym((TPZFrontSym<long_double> *)this_00);
  this_01 = (TPZVec<int> *)(in_RDI + 0x210);
  TPZVec<int>::TPZVec(this_01);
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x230));
  TPZFrontSym<long_double>::Reset((TPZFrontSym<long_double> *)this_00,(int64_t)this_01);
  TPZFileEqnStorage<long_double>::Reset((TPZFileEqnStorage<long_double> *)(in_RDI + 0x20));
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *(undefined8 *)(in_RDI + 0x208) = 0xffffffffffffffff;
  *(undefined8 *)(in_RDI + 0x200) = 0;
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::TPZFrontMatrix() : TPZRegisterClassId(&TPZFrontMatrix::ClassId),
TPZAbstractFrontMatrix<TVar>()
{
	fFront.Reset();
	fStorage.Reset();
	fNumElConnected.Resize(0);
	fNumElConnectedBackup.Resize(0);
	fLastDecomposed = -1;
	fNumEq=0;
}